

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O2

UModelIndex * __thiscall
TreeModel::addItem(UModelIndex *__return_storage_ptr__,TreeModel *this,UINT32 offset,UINT8 type,
                  UINT8 subtype,CBString *name,CBString *text,CBString *info,UByteArray *header,
                  UByteArray *body,UByteArray *tail,ItemFixedState fixed,UModelIndex *parent,
                  UINT8 mode)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  TreeItem *this_00;
  TreeModel *this_01;
  TreeItem *parent_00;
  TreeItem *local_70;
  UModelIndex local_48;
  
  bVar2 = UModelIndex::isValid(parent);
  if (bVar2) {
    local_70 = (TreeItem *)parent->i;
    if ((mode & 0xfe) == 2) {
      parent_00 = local_70->parentItem;
      UModelIndex::parent(&local_48,parent);
      iVar1 = local_48.c;
      goto LAB_0013efdc;
    }
    iVar1 = parent->c;
    parent_00 = local_70;
  }
  else {
    parent_00 = this->rootItem;
    iVar1 = 0;
  }
  local_70 = (TreeItem *)0x0;
LAB_0013efdc:
  this_01 = (TreeModel *)0x118;
  this_00 = (TreeItem *)operator_new(0x118);
  bVar2 = compressed(this_01,parent);
  TreeItem::TreeItem(this_00,offset,type,subtype,name,text,info,header,body,tail,false,bVar2,
                     parent_00);
  switch(mode) {
  case '\0':
    TreeItem::appendChild(parent_00,this_00);
    break;
  case '\x01':
    TreeItem::prependChild(parent_00,this_00);
    break;
  case '\x02':
    TreeItem::insertChildBefore(parent_00,local_70,this_00);
    break;
  case '\x03':
    TreeItem::insertChildAfter(parent_00,local_70,this_00);
    break;
  default:
    TreeItem::~TreeItem(this_00);
    operator_delete(this_00);
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    __return_storage_ptr__->i = 0;
    __return_storage_ptr__->m = (TreeModel *)0x0;
    return __return_storage_ptr__;
  }
  iVar3 = TreeItem::row(this_00);
  __return_storage_ptr__->r = iVar3;
  __return_storage_ptr__->c = iVar1;
  __return_storage_ptr__->i = (uint64_t)this_00;
  __return_storage_ptr__->m = this;
  setFixed(this,__return_storage_ptr__,fixed != Movable);
  return __return_storage_ptr__;
}

Assistant:

UModelIndex TreeModel::addItem(const UINT32 offset, const UINT8 type, const UINT8 subtype,
                               const UString & name, const UString & text, const UString & info,
                               const UByteArray & header, const UByteArray & body, const UByteArray & tail,
                               const ItemFixedState fixed,
                               const UModelIndex & parent, const UINT8 mode)
{
    TreeItem *item = 0;
    TreeItem *parentItem = 0;
    int parentColumn = 0;
    
    if (!parent.isValid())
        parentItem = rootItem;
    else
    {
        if (mode == CREATE_MODE_BEFORE || mode == CREATE_MODE_AFTER) {
            item = static_cast<TreeItem*>(parent.internalPointer());
            parentItem = item->parent();
            parentColumn = parent.parent().column();
        }
        else {
            parentItem = static_cast<TreeItem*>(parent.internalPointer());
            parentColumn = parent.column();
        }
    }
    
    TreeItem *newItem = new TreeItem(offset, type, subtype, name, text, info, header, body, tail, Movable, this->compressed(parent), parentItem);
    
    if (mode == CREATE_MODE_APPEND) {
        emit layoutAboutToBeChanged();
        parentItem->appendChild(newItem);
    }
    else if (mode == CREATE_MODE_PREPEND) {
        emit layoutAboutToBeChanged();
        parentItem->prependChild(newItem);
    }
    else if (mode == CREATE_MODE_BEFORE) {
        emit layoutAboutToBeChanged();
        parentItem->insertChildBefore(item, newItem);
    }
    else if (mode == CREATE_MODE_AFTER) {
        emit layoutAboutToBeChanged();
        parentItem->insertChildAfter(item, newItem);
    }
    else {
        delete newItem;
        return UModelIndex();
    }
    
    emit layoutChanged();
    
    UModelIndex created = createIndex(newItem->row(), parentColumn, newItem);
    setFixed(created, (bool)fixed); // Non-trivial logic requires additional call
    return created;
}